

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkInsertNewLogic(Abc_Ntk_t *pNtkH,Abc_Ntk_t *pNtkL)

{
  void *pvVar1;
  long *plVar2;
  Abc_Des_t *pAVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Ntk_t *pAVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  long lVar13;
  
  if (pNtkH->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2ba,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkH) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,699,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[10] < 1) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkH) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,700,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2be,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2bf,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x2c0,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtkL);
  pNtk = Abc_NtkAlloc(pNtkL->ntkType,pNtkL->ntkFunc,1);
  pcVar5 = Extra_UtilStrsav(pNtkH->pName);
  pNtk->pName = pcVar5;
  pcVar5 = Extra_UtilStrsav(pNtkH->pSpec);
  pNtk->pSpec = pcVar5;
  for (iVar11 = 0; iVar11 < pNtkH->vPis->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = Abc_NtkPi(pNtkH,iVar11);
    pAVar6 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
    pcVar5 = Abc_ObjName(pAVar6);
    pAVar7 = Abc_NtkFindNet(pNtkL,pcVar5);
    if ((pAVar7 == (Abc_Obj_t *)0x0) ||
       ((*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x14) & 0xf) != 2)
       ) {
      pcVar5 = Abc_ObjName(pAVar6);
      pcVar12 = "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n";
      goto LAB_006a6899;
    }
    pvVar1 = (pAVar7->field_6).pTemp;
    pcVar5 = Abc_ObjName(pAVar6);
    if (pvVar1 != (void *)0x0) {
      pcVar12 = "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n";
      goto LAB_006a6899;
    }
    pAVar6 = Abc_NtkFindOrCreateNet(pNtk,pcVar5);
    (pAVar7->field_6).pCopy = pAVar6;
    Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray],0);
  }
  for (iVar11 = 0; iVar11 < pNtkH->vBoxes->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = Abc_NtkBox(pNtkH,iVar11);
    if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 10) {
      Abc_NtkDupBox(pNtk,pAVar6,0);
      ((pAVar6->field_6).pCopy)->field_5 = pAVar6->field_5;
      for (lVar13 = 0; lVar13 < (pAVar6->vFanouts).nSize; lVar13 = lVar13 + 1) {
        plVar2 = (long *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar13]];
        pAVar7 = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
        pcVar5 = Abc_ObjName(pAVar7);
        pAVar8 = Abc_NtkFindNet(pNtkL,pcVar5);
        if ((pAVar8 == (Abc_Obj_t *)0x0) ||
           ((*(uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x14) & 0xf)
            != 2)) {
          pcVar5 = Abc_ObjName(pAVar7);
          pcVar12 = Abc_ObjName(pAVar6);
          printf("Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n"
                 ,pcVar5,pcVar12);
          goto LAB_006a68e7;
        }
        pvVar1 = (pAVar8->field_6).pTemp;
        pcVar5 = Abc_ObjName(pAVar7);
        if (pvVar1 != (void *)0x0) {
          printf("Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n",pcVar5);
          goto LAB_006a68e7;
        }
        pAVar7 = Abc_NtkFindOrCreateNet(pNtk,pcVar5);
        (pAVar8->field_6).pCopy = pAVar7;
        *(long *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x40) = plVar2[8];
      }
    }
  }
  iVar11 = 0;
LAB_006a6908:
  if (pNtkH->vPos->nSize <= iVar11) {
    for (iVar11 = 0; iVar11 < pNtkH->vBoxes->nSize; iVar11 = iVar11 + 1) {
      pAVar6 = Abc_NtkBox(pNtkH,iVar11);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 10) {
        for (lVar13 = 0; lVar13 < (pAVar6->vFanins).nSize; lVar13 = lVar13 + 1) {
          plVar2 = (long *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar13]];
          pAVar7 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
          Abc_ObjName(pAVar7);
          pcVar5 = Abc_ObjName(pAVar7);
          pAVar8 = Abc_NtkFindNet(pNtkL,pcVar5);
          if ((pAVar8 == (Abc_Obj_t *)0x0) ||
             (pvVar1 = pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray],
             (*(uint *)((long)pvVar1 + 0x14) & 0xf) != 3)) {
            pcVar5 = Abc_ObjName(pAVar7);
            pcVar12 = Abc_ObjName(pAVar6);
            printf("There is no PO corresponding to the input %s of blackbox %s.\n",pcVar5,pcVar12);
            goto LAB_006a68e7;
          }
          if ((pAVar8->field_6).pCopy == (Abc_Obj_t *)0x0) {
            pcVar5 = Abc_ObjName(pAVar7);
            pAVar7 = Abc_NtkFindOrCreateNet(pNtk,pcVar5);
            (pAVar8->field_6).pCopy = pAVar7;
            *(long *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray] + 0x40) =
                 plVar2[8];
          }
          else if (*(long *)((long)pvVar1 + 0x40) == 0) {
            *(Abc_Obj_t **)((long)pvVar1 + 0x40) = (Abc_Obj_t *)plVar2[8];
          }
          else {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],(pAVar8->field_6).pCopy);
          }
        }
      }
    }
    for (iVar11 = 0; iVar4 = pNtkL->vObjs->nSize, iVar11 < iVar4; iVar11 = iVar11 + 1) {
      pAVar6 = Abc_NtkObj(pNtkL,iVar11);
      if (((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).pTemp == (void *)0x0)) &&
         (uVar10 = *(uint *)&pAVar6->field_0x14 & 0xf, uVar10 != 3)) {
        Abc_NtkDupObj(pNtk,pAVar6,(uint)(uVar10 == 6));
      }
    }
    for (iVar11 = 0; iVar11 < iVar4; iVar11 = iVar11 + 1) {
      pAVar6 = Abc_NtkObj(pNtkL,iVar11);
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        for (lVar13 = 0; lVar13 < (pAVar6->vFanins).nSize; lVar13 = lVar13 + 1) {
          if ((pAVar6->field_6).pCopy != (Abc_Obj_t *)0x0) {
            Abc_ObjAddFanin((pAVar6->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar13]] +
                             0x40));
          }
        }
      }
      iVar4 = pNtkL->vObjs->nSize;
    }
    pAVar3 = pNtkH->pDesign;
    pNtkH->pDesign = (Abc_Des_t *)0x0;
    pAVar9 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar3->vModules,0);
    if (pAVar9 != pNtkH) {
      __assert_fail("Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Vec_PtrWriteEntry(pAVar3->vModules,0,pNtk);
    pNtk->pDesign = pAVar3;
    iVar11 = Abc_NtkCheck(pNtk);
    if (iVar11 == 0) {
      fwrite("Abc_NtkInsertNewLogic(): Network check has failed.\n",0x33,1,_stdout);
LAB_006a68e7:
      Abc_NtkDelete(pNtk);
      pNtk = (Abc_Ntk_t *)0x0;
    }
    return pNtk;
  }
  pAVar6 = Abc_NtkPo(pNtkH,iVar11);
  pAVar6 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
  pcVar5 = Abc_ObjName(pAVar6);
  pAVar7 = Abc_NtkFindNet(pNtkL,pcVar5);
  if ((pAVar7 != (Abc_Obj_t *)0x0) &&
     ((*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray] + 0x14) & 0xf) == 3))
  goto code_r0x006a6971;
  pcVar5 = Abc_ObjName(pAVar6);
  pcVar12 = "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n";
LAB_006a6899:
  printf(pcVar12,pcVar5);
  goto LAB_006a68e7;
code_r0x006a6971:
  if ((pAVar7->field_6).pTemp == (void *)0x0) {
    pcVar5 = Abc_ObjName(pAVar6);
    pAVar6 = Abc_NtkFindOrCreateNet(pNtk,pcVar5);
    (pAVar7->field_6).pCopy = pAVar6;
    Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray],0);
  }
  iVar11 = iVar11 + 1;
  goto LAB_006a6908;
}

Assistant:

Abc_Ntk_t * Abc_NtkInsertNewLogic( Abc_Ntk_t * pNtkH, Abc_Ntk_t * pNtkL )
{
    Abc_Des_t * pDesign;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjH, * pObjL, * pNetH, * pNetL, * pTermH;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtkH) );
    assert( Abc_NtkWhiteboxNum(pNtkH) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkH) > 0 );

    assert( Abc_NtkIsNetlist(pNtkL) );
    assert( Abc_NtkWhiteboxNum(pNtkL) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkL) == 0 );

    // prepare the logic network for copying
    Abc_NtkCleanCopy( pNtkL );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtkL->ntkType, pNtkL->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtkH->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtkH->pSpec );

    // make sure every PI/PO has a PI/PO in the processed network
    Abc_NtkForEachPi( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanout0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanin0(pNetL), 0 );
    }

    // make sure every BB has a PI/PO in the processed network
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        // duplicate the box 
        Abc_NtkDupBox( pNtkNew, pObjH, 0 );
        pObjH->pCopy->pData = pObjH->pData;
        // create PIs
        Abc_ObjForEachFanout( pObjH, pTermH, k )
        {
            pNetH = Abc_ObjFanout0( pTermH );
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            if ( pNetL->pCopy )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n", Abc_ObjName(pNetH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PI
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanin0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    Abc_NtkForEachPo( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanin0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
            continue;
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanout0(pNetL), 0 );
    }
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        Abc_ObjForEachFanin( pObjH, pTermH, k )
        {
            char * pName;
            pNetH = Abc_ObjFanin0( pTermH );
            pName = Abc_ObjName(pNetH);
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
            {
                printf( "There is no PO corresponding to the input %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PO
            if ( pNetL->pCopy )
            {
                if ( Abc_ObjFanout0(pNetL)->pCopy == NULL )
                    Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
                else
                    Abc_ObjAddFanin( pTermH->pCopy, pNetL->pCopy );
                continue;
            }
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    // duplicate other objects of the logic network
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        if ( pObjL->pCopy == NULL && !Abc_ObjIsPo(pObjL) ) // skip POs feeding into PIs
            Abc_NtkDupObj( pNtkNew, pObjL, Abc_ObjIsNet(pObjL) );

    // connect objects
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        Abc_ObjForEachFanin( pObjL, pNetL, k )
            if ( pObjL->pCopy )
                Abc_ObjAddFanin( pObjL->pCopy, pNetL->pCopy );

    // transfer the design
    pDesign = pNtkH->pDesign;  pNtkH->pDesign = NULL;
    assert( Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH );
    Vec_PtrWriteEntry( pDesign->vModules, 0, pNtkNew );
    pNtkNew->pDesign = pDesign;

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkInsertNewLogic(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}